

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * lest::to_string<long>(string *__return_storage_ptr__,long *value)

{
  long *in_RDX;
  string local_30;
  
  string_maker<long>::to_string_abi_cxx11_(&local_30,(string_maker<long> *)value,in_RDX);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p == &local_30.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,local_30.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_30.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_30._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_30.field_2._M_allocated_capacity._1_7_,local_30.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_30._M_string_length;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}